

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateTypeidMemberAccess
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,SynIdentifier *member)

{
  TypeBase *pTVar1;
  _func_int *p_Var2;
  longlong lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar8;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  TypeBase *pTVar9;
  InplaceStr *this;
  TypeBase *extraout_RDX;
  _func_int **pp_Var10;
  TypeStruct *type_00;
  TypeRef *pTVar11;
  MemberHandle *pMVar12;
  ConstantData *pCVar13;
  long *plVar14;
  long lVar15;
  TypeBase *unaff_R15;
  bool bVar16;
  InplaceStr IVar17;
  InplaceStr local_48;
  TypeBase *local_38;
  undefined4 extraout_var;
  
  if (member == (SynIdentifier *)0x0) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar7->typeID = 1;
    pEVar7->source = source;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248dc8;
    pEVar7[1]._vptr_ExprBase = (_func_int **)type;
    return pEVar7;
  }
  if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x18)) {
    pTVar9 = (TypeBase *)0x0;
  }
  if (pTVar9 == (TypeBase *)0x0) {
    bVar16 = true;
  }
  else {
    pTVar11 = pTVar9[2].refType;
    bVar16 = pTVar11 == (TypeRef *)0x0;
    unaff_R15 = type;
    if (!bVar16) {
      do {
        bVar4 = InplaceStr::operator==
                          ((InplaceStr *)((pTVar11->super_TypeBase)._vptr_TypeBase + 8),
                           &member->name);
        if (bVar4) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          unaff_R15 = (TypeBase *)CONCAT44(extraout_var_00,iVar5);
          pTVar1 = ctx->typeTypeID;
          lVar3 = *(longlong *)&(pTVar11->super_TypeBase).typeID;
          unaff_R15->typeID = 8;
          (unaff_R15->name).begin = (char *)source;
          (unaff_R15->name).end = (char *)pTVar1;
          unaff_R15->importModule = (ModuleData *)0x0;
          *(bool *)&unaff_R15->typeIndex = false;
          unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
          unaff_R15->size = lVar3;
          break;
        }
        pTVar11 = (TypeRef *)(pTVar11->super_TypeBase).name.begin;
        bVar16 = pTVar11 == (TypeRef *)0x0;
        unaff_R15 = extraout_RDX;
      } while (!bVar16);
    }
    if (bVar16) {
      plVar14 = (long *)pTVar9[2].size;
      bVar16 = plVar14 == (long *)0x0;
      if (!bVar16) {
        do {
          bVar4 = InplaceStr::operator==((InplaceStr *)(*plVar14 + 0x40),&member->name);
          if (bVar4) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            unaff_R15 = (TypeBase *)CONCAT44(extraout_var_01,iVar5);
            pTVar9 = ctx->typeTypeID;
            lVar15 = plVar14[1];
            unaff_R15->typeID = 8;
            (unaff_R15->name).begin = (char *)source;
            (unaff_R15->name).end = (char *)pTVar9;
            unaff_R15->importModule = (ModuleData *)0x0;
            *(bool *)&unaff_R15->typeIndex = false;
            unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
            unaff_R15->size = lVar15;
            break;
          }
          plVar14 = (long *)plVar14[2];
          bVar16 = plVar14 == (long *)0x0;
        } while (!bVar16);
      }
    }
    else {
      bVar16 = false;
    }
  }
  if (!bVar16) {
    return (ExprBase *)unaff_R15;
  }
  if (((type == (TypeBase *)0x0) || (0x19 < type->typeID)) ||
     (type_00 = (TypeStruct *)type, (0x3130000U >> (type->typeID & 0x1f) & 1) == 0)) {
    type_00 = (TypeStruct *)0x0;
  }
  bVar16 = true;
  if (type_00 != (TypeStruct *)0x0) {
    pMVar12 = (type_00->members).head;
    bVar16 = pMVar12 == (MemberHandle *)0x0;
    local_38 = type;
    if (!bVar16) {
      do {
        bVar4 = InplaceStr::operator==(&pMVar12->variable->name->name,&member->name);
        if (bVar4) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          unaff_R15 = (TypeBase *)CONCAT44(extraout_var_02,iVar5);
          pTVar9 = ctx->typeTypeID;
          pTVar1 = pMVar12->variable->type;
          unaff_R15->typeID = 8;
          (unaff_R15->name).begin = (char *)source;
          (unaff_R15->name).end = (char *)pTVar9;
          unaff_R15->importModule = (ModuleData *)0x0;
          *(bool *)&unaff_R15->typeIndex = false;
          unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
          unaff_R15->size = (longlong)pTVar1;
          break;
        }
        pMVar12 = pMVar12->next;
        bVar16 = pMVar12 == (MemberHandle *)0x0;
      } while (!bVar16);
    }
    if (bVar16) {
      pCVar13 = (type_00->constants).head;
      bVar16 = pCVar13 == (ConstantData *)0x0;
      if (!bVar16) {
        do {
          bVar4 = InplaceStr::operator==(&pCVar13->name->name,&member->name);
          if (bVar4) {
            unaff_R15 = (TypeBase *)CreateLiteralCopy(ctx,source,pCVar13->value);
            break;
          }
          pCVar13 = pCVar13->next;
          bVar16 = pCVar13 == (ConstantData *)0x0;
        } while (!bVar16);
      }
      type = local_38;
      if (bVar16) {
        local_48.begin = "hasMember";
        local_48.end = "";
        bVar4 = InplaceStr::operator==(&member->name,&local_48);
        bVar16 = true;
        if (bVar4) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          unaff_R15 = (TypeBase *)CONCAT44(extraout_var_03,iVar5);
          pTVar9 = ctx->typeTypeID;
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          IVar17 = GetMemberSetTypeName(ctx,&type_00->super_TypeBase);
          TypeMemberSet::TypeMemberSet
                    ((TypeMemberSet *)CONCAT44(extraout_var_04,iVar5),IVar17,type_00);
          unaff_R15->typeID = 8;
          (unaff_R15->name).begin = (char *)source;
          (unaff_R15->name).end = (char *)pTVar9;
          unaff_R15->importModule = (ModuleData *)0x0;
          *(bool *)&unaff_R15->typeIndex = false;
          unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
          unaff_R15->size = (longlong)CONCAT44(extraout_var_04,iVar5);
          bVar16 = false;
        }
      }
      else {
        bVar16 = false;
      }
    }
    else {
      bVar16 = false;
      type = local_38;
    }
  }
  if (!bVar16) {
    return (ExprBase *)unaff_R15;
  }
  if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x17)) {
    pTVar9 = (TypeBase *)0x0;
  }
  if (pTVar9 == (TypeBase *)0x0) {
    bVar16 = true;
  }
  else {
    lVar15 = *(long *)(pTVar9[1]._vptr_TypeBase[0x18] + 0x50);
    bVar16 = lVar15 == 0;
    if (!bVar16) {
      do {
        bVar4 = InplaceStr::operator==((InplaceStr *)(lVar15 + 0x40),&member->name);
        if (bVar4) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          unaff_R15 = (TypeBase *)CONCAT44(extraout_var_05,iVar5);
          pTVar9 = ctx->typeTypeID;
          pTVar1 = ctx->typeGeneric;
          unaff_R15->typeID = 8;
          (unaff_R15->name).begin = (char *)source;
          (unaff_R15->name).end = (char *)pTVar9;
          unaff_R15->importModule = (ModuleData *)0x0;
          *(bool *)&unaff_R15->typeIndex = false;
          unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
          unaff_R15->size = (longlong)pTVar1;
          break;
        }
        lVar15 = *(long *)(lVar15 + 0x30);
        if ((lVar15 == 0) || (*(int *)(lVar15 + 8) != 4)) {
          lVar15 = 0;
        }
        bVar16 = lVar15 == 0;
      } while (!bVar16);
    }
  }
  if (!bVar16) {
    return (ExprBase *)unaff_R15;
  }
  this = &member->name;
  local_48.begin = "isReference";
  local_48.end = "";
  bVar16 = InplaceStr::operator==(this,&local_48);
  if (bVar16) {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_06,iVar5);
    pTVar9 = ctx->typeBool;
    if (type != (TypeBase *)0x0) {
      bVar16 = type->typeID == 0x12;
      goto LAB_0016d3cf;
    }
  }
  else {
    local_48.begin = "isArray";
    local_48.end = "";
    bVar16 = InplaceStr::operator==(this,&local_48);
    if (bVar16) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_07,iVar5);
      pTVar9 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar16 = type->typeID == 0x13;
        if (type != (TypeBase *)0x0 && !bVar16) {
          bVar16 = type->typeID == 0x14;
        }
        goto LAB_0016d3cf;
      }
    }
    else {
      local_48.begin = "isFunction";
      local_48.end = "";
      bVar16 = InplaceStr::operator==(this,&local_48);
      if (!bVar16) {
        local_48.begin = "arraySize";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016d45c:
            pTVar9 = (TypeBase *)0x0;
LAB_0016d45e:
            if (pTVar9 != (TypeBase *)0x0) {
              iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar7 = (ExprBase *)CONCAT44(extraout_var_09,iVar5);
              pTVar1 = ctx->typeInt;
              pp_Var10 = *(_func_int ***)&pTVar9[1].typeID;
              pEVar7->typeID = 6;
              pEVar7->source = source;
              pEVar7->type = pTVar1;
              pEVar7->next = (ExprBase *)0x0;
              pEVar7->listed = false;
              pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
              pEVar7[1]._vptr_ExprBase = pp_Var10;
              return pEVar7;
            }
            if ((type != (TypeBase *)0x0) && (type->typeID == 0x14)) {
              iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar7 = (ExprBase *)CONCAT44(extraout_var_10,iVar5);
              pTVar9 = ctx->typeInt;
              pEVar7->typeID = 6;
              pEVar7->source = source;
              pEVar7->type = pTVar9;
              pEVar7->next = (ExprBase *)0x0;
              pEVar7->listed = false;
              pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
              pEVar7[1]._vptr_ExprBase = (_func_int **)0xffffffffffffffff;
              return pEVar7;
            }
            anon_unknown.dwarf_c6b42::Report
                      (ctx,source,
                       "ERROR: \'arraySize\' can only be applied to an array type, but we have \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
            goto LAB_0016d544;
          }
          if (type->typeID != 0) {
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x13))
            goto LAB_0016d45c;
            goto LAB_0016d45e;
          }
LAB_0016dbb9:
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          pEVar7 = (ExprBase *)CONCAT44(extraout_var_21,iVar5);
          pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          pEVar7->typeID = 0;
          pEVar7->source = source;
LAB_0016dbe2:
          pEVar7->type = pTVar9;
          pEVar7->next = (ExprBase *)0x0;
          pEVar7->listed = false;
          pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00248b28;
          pEVar7[2]._vptr_ExprBase = (_func_int **)0x0;
          pEVar7[1]._vptr_ExprBase = (_func_int **)&pEVar7[1].source;
          *(undefined8 *)&pEVar7[1].typeID = 0x400000000;
          return pEVar7;
        }
LAB_0016d544:
        local_48.begin = "size";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016d594:
            pTVar9 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0) {
              iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
              pEVar7 = (ExprBase *)CONCAT44(extraout_var_19,iVar5);
              pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
              pEVar7->typeID = 0;
              pEVar7->source = source;
              goto LAB_0016dbe2;
            }
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x1b))
            goto LAB_0016d594;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            unaff_R15 = (TypeBase *)CONCAT44(extraout_var_11,iVar5);
            pTVar1 = ctx->typeInt;
            pp_Var10 = pTVar9[1]._vptr_TypeBase;
            uVar8 = 0;
            if (pp_Var10 != (_func_int **)0x0) {
              do {
                uVar6 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar6;
                pp_Var10 = (_func_int **)pp_Var10[1];
              } while (pp_Var10 != (_func_int **)0x0);
              uVar8 = (ulong)uVar6;
            }
            unaff_R15->typeID = 6;
            (unaff_R15->name).begin = (char *)source;
            (unaff_R15->name).end = (char *)pTVar1;
            unaff_R15->importModule = (ModuleData *)0x0;
            *(bool *)&unaff_R15->typeIndex = false;
            unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248500;
            unaff_R15->size = uVar8;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            return (ExprBase *)unaff_R15;
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: \'size\' can only be applied to a function type, but we have \'%.*s\'",
                     (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_48.begin = "argument";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016d67b:
            pTVar9 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0) goto LAB_0016dbb9;
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x15))
            goto LAB_0016d67b;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_12,iVar5);
            pTVar1 = ctx->typeTypeID;
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
            IVar17 = GetArgumentSetTypeName(ctx,*(IntrusiveList<TypeHandle> *)&pTVar9[1].typeID);
            TypeArgumentSet::TypeArgumentSet
                      ((TypeArgumentSet *)CONCAT44(extraout_var_13,iVar5),IVar17,
                       *(IntrusiveList<TypeHandle> *)&pTVar9[1].typeID);
            pEVar7->typeID = 8;
            pEVar7->source = source;
            pEVar7->type = pTVar1;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
            pEVar7[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_13,iVar5);
            return pEVar7;
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: \'argument\' can only be applied to a function type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_48.begin = "return";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016d78c:
            pTVar9 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0) goto LAB_0016dbb9;
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x15))
            goto LAB_0016d78c;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_14,iVar5);
            pTVar1 = ctx->typeTypeID;
            pp_Var10 = pTVar9[1]._vptr_TypeBase;
            pEVar7->typeID = 8;
            pEVar7->source = source;
            pEVar7->type = pTVar1;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
            pEVar7[1]._vptr_ExprBase = pp_Var10;
            return pEVar7;
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: \'return\' can only be applied to a function type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_48.begin = "target";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016d85c:
            pTVar9 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0) goto LAB_0016dbb9;
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x12))
            goto LAB_0016d85c;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_15,iVar5);
            pTVar1 = ctx->typeTypeID;
            pp_Var10 = pTVar9[1]._vptr_TypeBase;
            pEVar7->typeID = 8;
            pEVar7->source = source;
            pEVar7->type = pTVar1;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
            pEVar7[1]._vptr_ExprBase = pp_Var10;
            return pEVar7;
          }
          if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x13)) {
            pTVar9 = (TypeBase *)0x0;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_16,iVar5);
            pTVar1 = ctx->typeTypeID;
            pp_Var10 = pTVar9[1]._vptr_TypeBase;
            pEVar7->typeID = 8;
            pEVar7->source = source;
            pEVar7->type = pTVar1;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
            pEVar7[1]._vptr_ExprBase = pp_Var10;
            return pEVar7;
          }
          if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x14)) {
            pTVar9 = (TypeBase *)0x0;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar7 = (ExprBase *)CONCAT44(extraout_var_17,iVar5);
            pTVar1 = ctx->typeTypeID;
            pp_Var10 = *(_func_int ***)&pTVar9[1].typeIndex;
            pEVar7->typeID = 8;
            pEVar7->source = source;
            pEVar7->type = pTVar1;
            pEVar7->next = (ExprBase *)0x0;
            pEVar7->listed = false;
            pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
            pEVar7[1]._vptr_ExprBase = pp_Var10;
            return pEVar7;
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: \'target\' can only be applied to a pointer or array type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_48.begin = "first";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (bVar16) {
          if (type == (TypeBase *)0x0) {
LAB_0016da17:
            pTVar9 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0) goto LAB_0016dbb9;
            if ((type == (TypeBase *)0x0) || (pTVar9 = type, type->typeID != 0x1b))
            goto LAB_0016da17;
          }
          if (pTVar9 != (TypeBase *)0x0) {
            if (pTVar9[1]._vptr_TypeBase == (_func_int **)0x0) {
              unaff_R15 = (TypeBase *)0x0;
              anon_unknown.dwarf_c6b42::Report(ctx,source,"ERROR: function argument set is empty");
            }
            else {
              iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              unaff_R15 = (TypeBase *)CONCAT44(extraout_var_18,iVar5);
              pTVar1 = ctx->typeTypeID;
              p_Var2 = *pTVar9[1]._vptr_TypeBase;
              unaff_R15->typeID = 8;
              (unaff_R15->name).begin = (char *)source;
              (unaff_R15->name).end = (char *)pTVar1;
              unaff_R15->importModule = (ModuleData *)0x0;
              *(bool *)&unaff_R15->typeIndex = false;
              unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
              unaff_R15->size = (longlong)p_Var2;
            }
          }
          if (pTVar9 != (TypeBase *)0x0) {
            return (ExprBase *)unaff_R15;
          }
          anon_unknown.dwarf_c6b42::Report
                    (ctx,source,
                     "ERROR: \'first\' can only be applied to a function type, but we have \'%.*s\'"
                     ,(ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        local_48.begin = "last";
        local_48.end = "";
        bVar16 = InplaceStr::operator==(this,&local_48);
        if (!bVar16) {
          return (ExprBase *)0x0;
        }
        if (type != (TypeBase *)0x0) {
          if (type->typeID == 0) goto LAB_0016dbb9;
          if ((type != (TypeBase *)0x0) && (pTVar9 = type, type->typeID == 0x1b)) goto LAB_0016db48;
        }
        pTVar9 = (TypeBase *)0x0;
LAB_0016db48:
        if (pTVar9 != (TypeBase *)0x0) {
          if (pTVar9[1]._vptr_TypeBase == (_func_int **)0x0) {
            unaff_R15 = (TypeBase *)0x0;
            anon_unknown.dwarf_c6b42::Report(ctx,source,"ERROR: function argument set is empty");
          }
          else {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            unaff_R15 = (TypeBase *)CONCAT44(extraout_var_20,iVar5);
            pTVar1 = ctx->typeTypeID;
            lVar3 = **(longlong **)&pTVar9[1].typeID;
            unaff_R15->typeID = 8;
            (unaff_R15->name).begin = (char *)source;
            (unaff_R15->name).end = (char *)pTVar1;
            unaff_R15->importModule = (ModuleData *)0x0;
            *(bool *)&unaff_R15->typeIndex = false;
            unaff_R15->_vptr_TypeBase = (_func_int **)&PTR__ExprBase_00248570;
            unaff_R15->size = lVar3;
          }
        }
        if (pTVar9 != (TypeBase *)0x0) {
          return (ExprBase *)unaff_R15;
        }
        anon_unknown.dwarf_c6b42::Report
                  (ctx,source,
                   "ERROR: \'last\' can only be applied to a function type, but we have \'%.*s\'",
                   (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        return (ExprBase *)0x0;
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_08,iVar5);
      pTVar9 = ctx->typeBool;
      if (type != (TypeBase *)0x0) {
        bVar16 = type->typeID == 0x15;
        goto LAB_0016d3cf;
      }
    }
  }
  bVar16 = false;
LAB_0016d3cf:
  pEVar7->typeID = 3;
  pEVar7->source = source;
  pEVar7->type = pTVar9;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
  pEVar7->field_0x29 = bVar16;
  return pEVar7;
}

Assistant:

ExprBase* CreateTypeidMemberAccess(ExpressionContext &ctx, SynBase *source, TypeBase *type, SynIdentifier *member)
{
	if(!member)
		return new (ctx.get<ExprErrorTypeMemberAccess>()) ExprErrorTypeMemberAccess(source, ctx.GetErrorType(), type);

	if(TypeClass *classType = getType<TypeClass>(type))
	{
		for(MatchData *curr = classType->aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name== member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}

		for(MatchData *curr = classType->generics.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->type);
		}
	}

	if(TypeStruct *structType = getType<TypeStruct>(type))
	{
		for(MemberHandle *curr = structType->members.head; curr; curr = curr->next)
		{
			if(curr->variable->name->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, curr->variable->type);
		}

		for(ConstantData *curr = structType->constants.head; curr; curr = curr->next)
		{
			if(curr->name->name == member->name)
				return CreateLiteralCopy(ctx, source, curr->value);
		}

		if(member->name == InplaceStr("hasMember"))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeMemberSet>()) TypeMemberSet(GetMemberSetTypeName(ctx, structType), structType));
	}

	if(TypeGenericClass *typeGenericClass = getType<TypeGenericClass>(type))
	{
		for(SynIdentifier *curr = typeGenericClass->proto->definition->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(curr->name == member->name)
				return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, ctx.typeGeneric);
		}
	}

	if(member->name == InplaceStr("isReference"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeRef>(type));
	}

	if(member->name == InplaceStr("isArray"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeArray>(type) || isType<TypeUnsizedArray>(type));
	}

	if(member->name == InplaceStr("isFunction"))
	{
		return new (ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(source, ctx.typeBool, isType<TypeFunction>(type));
	}

	if(member->name == InplaceStr("arraySize"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, arrType->length);

		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, -1);

		Report(ctx, source, "ERROR: 'arraySize' can only be applied to an array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("size"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(source, ctx.typeInt, argumentsType->types.size());

		Report(ctx, source, "ERROR: 'size' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("argument"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, new (ctx.get<TypeArgumentSet>()) TypeArgumentSet(GetArgumentSetTypeName(ctx, functionType->arguments), functionType->arguments));

		Report(ctx, source, "ERROR: 'argument' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("return"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeFunction *functionType = getType<TypeFunction>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, functionType->returnType);

		Report(ctx, source, "ERROR: 'return' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("target"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeRef *refType = getType<TypeRef>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, refType->subType);

		if(TypeArray *arrType = getType<TypeArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		if(TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, arrType->subType);

		Report(ctx, source, "ERROR: 'target' can only be applied to a pointer or array type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("first"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.head->type);
		}

		Report(ctx, source, "ERROR: 'first' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	if(member->name == InplaceStr("last"))
	{
		if(isType<TypeError>(type))
			return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());

		if(TypeArgumentSet *argumentsType = getType<TypeArgumentSet>(type))
		{
			if(argumentsType->types.empty())
			{
				Report(ctx, source, "ERROR: function argument set is empty");

				return NULL;
			}

			return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentsType->types.tail->type);
		}

		Report(ctx, source, "ERROR: 'last' can only be applied to a function type, but we have '%.*s'", FMT_ISTR(type->name));
	}

	return NULL;
}